

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O3

Status __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::GenerateCodeString
          (FBSCodeGenerator *this,Parser *parser,string *filename,string *output)

{
  string local_30;
  
  GenerateFBS(&local_30,parser,filename,this->no_log_);
  std::__cxx11::string::operator=((string *)output,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return OK;
}

Assistant:

Status GenerateCodeString(const Parser &parser, const std::string &filename,
                            std::string &output) override {
    output = GenerateFBS(parser, filename, no_log_);
    return Status::OK;
  }